

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage>
          (undefined8 param_1,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *param_2)

{
  bool_storage temp;
  object_storage *in_stack_ffffffffffffffb8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  
  cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage>
            (in_stack_ffffffffffffffc0);
  cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage>
            (param_2);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::object_storage&>
            (param_2,in_stack_ffffffffffffffb8);
  construct<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::bool_storage&>
            (param_2,(bool_storage *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void swap_l_r(identity<TypeL>,identity<TypeR>,basic_json& other) noexcept
        {
            TypeR temp{other.cast<TypeR>()};
            other.construct<TypeL>(cast<TypeL>());
            construct<TypeR>(temp);
        }